

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall
mjs::parser::parse_expression1(parser *this,expression_ptr *lhs,int outer_precedence)

{
  parser *this_00;
  token_type tt;
  expression *peVar1;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> uVar2;
  __uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_> _Var3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  wostream *pwVar9;
  int in_ECX;
  undefined4 in_register_00000014;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_1;
  wchar_t *extraout_RDX;
  wstring_view *s;
  pointer *__ptr;
  element_type *peVar10;
  wchar_t *in_R9;
  byte bVar11;
  wstring_view name;
  wstring_view message;
  token_type op;
  expression_ptr rhs;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  undefined1 local_218 [24];
  undefined1 local_200 [8];
  parser local_1f8 [2];
  token local_80;
  token local_58;
  
  args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
           CONCAT44(in_register_00000014,outer_precedence);
  bVar11 = *(int *)&lhs[2]._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl < 1 |
           *(byte *)((long)&lhs[0xf]._M_t.
                            super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                            .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 1);
  this_00 = (parser *)(local_200 + 8);
  local_238._16_4_ = in_ECX;
  local_238._24_8_ = args_1;
  local_200 = (undefined1  [8])this;
  do {
    local_238._20_4_ =
         *(undefined4 *)
          &lhs[0x10]._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    uVar6 = 100;
    if ((bVar11 & local_238._20_4_ == in_) == 0) {
      uVar6 = operator_precedence(local_238._20_4_);
    }
    if ((int)local_238._16_4_ < (int)uVar6) break;
    get_token(&local_58,(parser *)lhs);
    token::destroy(&local_58);
    if (local_238._20_4_ == question) {
      parse_assignment_expression(this_00);
      expect(&local_80,(parser *)lhs,colon,"parse_expression1",0x259);
      token::destroy(&local_80);
      parse_assignment_expression((parser *)local_218);
      make_expression<mjs::conditional_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_248,lhs,args_1,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_00);
      uVar4 = local_248._0_8_;
      local_248._0_8_ = (element_type *)0x0;
      peVar1 = (args_1->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)uVar4;
      if (peVar1 != (expression *)0x0) {
        (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 8))();
      }
      if ((element_type *)local_248._0_8_ != (element_type *)0x0) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
      local_248._0_8_ = (element_type *)0x0;
      peVar10 = (element_type *)local_218._0_8_;
    }
    else {
      if ((*(char *)&lhs[0xc]._M_t.
                     super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                     .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == '\x01') &&
         (bVar5 = is_assignment_op(local_238._20_4_), bVar5)) {
        uVar2._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
        _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
             *(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true> *)
              local_238._24_8_;
        iVar7 = (**(code **)(*(long *)uVar2._M_t.
                                      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                      .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl
                            + 0x18))
                          (uVar2._M_t.
                           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                           .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
        if ((iVar7 == 0) &&
           (name._M_str = extraout_RDX,
           name._M_len = *(size_t *)
                          ((long)uVar2._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                 .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl +
                          0x20),
           bVar5 = is_strict_mode_unassignable_identifier
                             (*(mjs **)((long)uVar2._M_t.
                                              super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                              .super__Head_base<0UL,_mjs::expression_*,_false>.
                                              _M_head_impl + 0x28),name), bVar5)) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)(local_200 + 8));
          pwVar9 = std::operator<<((wostream *)(local_200 + 8),"\"");
          local_218._8_8_ =
               *(undefined8 *)
                ((long)*(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                         *)local_238._24_8_ + 0x20);
          local_218._0_8_ =
               *(size_t *)
                ((long)*(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                         *)local_238._24_8_ + 0x28);
          cpp_quote_abi_cxx11_((wstring *)local_248,(mjs *)local_218,s);
          pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar9,(wchar_t *)local_248._0_8_,local_248._8_8_);
          std::operator<<(pwVar9,"\" may not be assigned in strict mode");
          if ((element_type *)local_248._0_8_ != (element_type *)local_238) {
            operator_delete((void *)local_248._0_8_,local_238._0_8_ * 4 + 4);
          }
          local_218._0_8_ =
               (lhs->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
          local_218._8_8_ =
               lhs[1]._M_t.
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((shared_ptr<mjs::source_file> *)
                       &((syntax_node *)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->
                         _M_use_count)->_vptr_syntax_node)->
                       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> =
                   *(int *)&((shared_ptr<mjs::source_file> *)
                            &((syntax_node *)
                             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->
                              _M_use_count)->_vptr_syntax_node)->
                            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> + 1;
              UNLOCK();
            }
            else {
              *(int *)&((shared_ptr<mjs::source_file> *)
                       &((syntax_node *)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->
                         _M_use_count)->_vptr_syntax_node)->
                       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> =
                   *(int *)&((shared_ptr<mjs::source_file> *)
                            &((syntax_node *)
                             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->
                              _M_use_count)->_vptr_syntax_node)->
                            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> + 1;
            }
          }
          local_218._16_4_ =
               *(undefined4 *)
                ((long)&lhs[0xc]._M_t.
                        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                        .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 4);
          local_218._20_4_ =
               *(undefined4 *)
                &lhs[6]._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
          std::__cxx11::wstringbuf::str();
          message._M_str = in_R9;
          message._M_len = local_248._0_8_;
          syntax_error((parser *)"parse_expression1",(char *)0x25e,(int)local_218,
                       (source_extend *)local_248._8_8_,message);
        }
      }
      parse_unary_expression(this_00);
      while( true ) {
        tt = *(token_type *)
              &lhs[0x10]._M_t.
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
        uVar8 = 100;
        if ((bVar11 & tt == in_) == 0) {
          uVar8 = operator_precedence(tt);
        }
        if ((uVar6 < uVar8) || ((uVar8 == uVar6 && (uVar8 = operator_precedence(tt), uVar8 < 0xf))))
        break;
        parse_expression1((parser *)local_248,lhs,(int)this_00);
        peVar10 = local_1f8[0].source_.
                  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1f8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_248._0_8_;
        local_248._0_8_ = (element_type *)0x0;
        if (peVar10 != (element_type *)0x0) {
          (**(code **)(*(long *)peVar10 + 8))();
        }
        if ((element_type *)local_248._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_248._0_8_ + 8))();
        }
      }
      args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               local_238._24_8_;
      make_expression<mjs::binary_expression,mjs::token_type_const&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_248,(token_type *)lhs,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_238 + 0x14),
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 local_238._24_8_);
      uVar4 = local_248._0_8_;
      local_248._0_8_ = (element_type *)0x0;
      _Var3._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
           *(tuple<mjs::expression_*,_std::default_delete<mjs::expression>_> *)args_1;
      *args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>)uVar4;
      peVar10 = (element_type *)local_248._0_8_;
      if ((__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)
          _Var3._M_t.
          super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
          super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)0x0) {
        (**(code **)(*(long *)_Var3._M_t.
                              super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                              .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 8))();
        peVar10 = (element_type *)local_248._0_8_;
      }
    }
    if (peVar10 != (element_type *)0x0) {
      (**(code **)(*(long *)peVar10 + 8))();
    }
    if (local_1f8[0].source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (**(code **)(*(long *)local_1f8[0].source_.
                            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 8))();
    }
  } while ((int)uVar6 <= (int)local_238._16_4_);
  *(expression **)local_200 =
       (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (tuple<mjs::expression_*,_std::default_delete<mjs::expression>_>)local_200;
}

Assistant:

expression_ptr parse_expression1(expression_ptr&& lhs, int outer_precedence) {
        auto prec = [no_in=supress_in_ || version_ < version::es3](token_type t) { return !no_in || t != token_type::in_ ? operator_precedence(t) : 100; };

        for (;;) {
            const auto op = current_token_type();
            const auto precedence = prec(op);
            if (precedence > outer_precedence) {
                break;
            }
            get_token();
            if (op == token_type::question) {
                auto l = parse_assignment_expression();
                EXPECT(token_type::colon);
                lhs = make_expression<conditional_expression>(std::move(lhs), std::move(l), parse_assignment_expression());
                continue;
            }
            if (strict_mode_ && is_assignment_op(op) && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be assigned in strict mode");
            }

            auto rhs = parse_unary_expression();
            for (;;) {
                const auto look_ahead = current_token_type();
                const auto look_ahead_precedence = prec(look_ahead);
                if (look_ahead_precedence > precedence || (look_ahead_precedence == precedence && !is_right_to_left(look_ahead))) {
                    break;
                }
                rhs = parse_expression1(std::move(rhs), look_ahead_precedence);
            }

            lhs = make_expression<binary_expression>(op, std::move(lhs), std::move(rhs));
        }
        return std::move(lhs);
    }